

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

cmGeneratorTarget * __thiscall
cmLocalGenerator::FindGeneratorTarget(cmLocalGenerator *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  __last;
  pointer pcVar2;
  const_iterator cVar3;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  _Var4;
  NamedGeneratorTargetFinder local_68;
  long *local_48 [2];
  long local_38 [2];
  
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->AliasTargets)._M_t,name);
  _Var4._M_current =
       (this->GeneratorTargets).
       super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (this->GeneratorTargets).
       super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((_Rb_tree_header *)cVar3._M_node == &(this->AliasTargets)._M_t._M_impl.super__Rb_tree_header)
  {
    paVar1 = &local_68.Name.field_2;
    pcVar2 = (name->_M_dataplus)._M_p;
    local_68.Name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar2,pcVar2 + name->_M_string_length);
    _Var4 = std::
            find_if<__gnu_cxx::__normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,NamedGeneratorTargetFinder>
                      (_Var4,__last,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.Name._M_dataplus._M_p != paVar1) {
      operator_delete(local_68.Name._M_dataplus._M_p,local_68.Name.field_2._M_allocated_capacity + 1
                     );
    }
    if (_Var4._M_current ==
        (this->GeneratorTargets).
        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return (cmGeneratorTarget *)0x0;
    }
  }
  else {
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,*(long *)(cVar3._M_node + 2),
               (long)&(cVar3._M_node[2]._M_parent)->_M_color + *(long *)(cVar3._M_node + 2));
    _Var4 = std::
            find_if<__gnu_cxx::__normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,NamedGeneratorTargetFinder>
                      (_Var4,__last,(NamedGeneratorTargetFinder *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  return *_Var4._M_current;
}

Assistant:

cmGeneratorTarget* cmLocalGenerator::FindGeneratorTarget(
    const std::string& name) const
{
  std::map<std::string, std::string>::const_iterator i =
      this->AliasTargets.find(name);
  if (i != this->AliasTargets.end())
    {
    std::vector<cmGeneratorTarget*>::const_iterator ai =
        std::find_if(this->GeneratorTargets.begin(),
                     this->GeneratorTargets.end(),
                     NamedGeneratorTargetFinder(i->second));
    return *ai;
    }
  std::vector<cmGeneratorTarget*>::const_iterator ti =
      std::find_if(this->GeneratorTargets.begin(),
                   this->GeneratorTargets.end(),
                   NamedGeneratorTargetFinder(name));
  if ( ti != this->GeneratorTargets.end() )
    {
    return *ti;
    }

  return 0;
}